

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerAdd
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  Index IVar4;
  Index IVar5;
  LocalGet *pLVar6;
  LocalGet *pLVar7;
  Binary *pBVar8;
  LocalSet *append;
  LocalSet *args;
  Const *right;
  LocalSet *ifTrue;
  If *args_1;
  Block *e;
  TempVar *pTVar9;
  optional<wasm::Type> type;
  undefined1 local_a0 [8];
  TempVar lowResult;
  TempVar highResult;
  
  pTVar9 = rightLow;
  getTemp((TempVar *)local_a0,this,(Type)0x2);
  getTemp((TempVar *)&lowResult.ty,this,(Type)0x2);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(leftLow);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(rightLow);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  append = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowResult.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(leftHigh);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  args = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowResult.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowResult.ty);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  right = Builder::makeConst<int>
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,1);
  pBVar8 = Builder::makeBinary(pBVar2,AddInt32,(Expression *)pLVar6,(Expression *)right);
  ifTrue = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
  pLVar6 = Builder::makeLocalGet(pBVar1,IVar4,(Type)0x2);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int(rightLow);
  pLVar7 = Builder::makeLocalGet(pBVar2,IVar4,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar1,LtUInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pTVar9;
  args_1 = Builder::makeIf(pBVar1,(Expression *)pBVar8,(Expression *)ifTrue,(Expression *)0x0,type);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
  pLVar6 = Builder::makeLocalGet(pBVar1,IVar4,(Type)0x2);
  e = Builder::blockify<wasm::LocalSet*,wasm::If*,wasm::LocalGet*>
                ((this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,(Expression *)result,
                 (Expression *)append,args,args_1,pLVar6);
  setOutParam(this,(Expression *)e,(TempVar *)&lowResult.ty);
  TempVar::~TempVar((TempVar *)&lowResult.ty);
  TempVar::~TempVar((TempVar *)local_a0);
  return e;
}

Assistant:

Block* lowerAdd(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    LocalSet* addLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* addHigh = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* carryBit = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(highResult, Type::i32),
                          builder->makeConst(int32_t(1))));
    If* checkOverflow = builder->makeIf(
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(lowResult, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)),
      carryBit);
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result = builder->blockify(result, addLow, addHigh, checkOverflow, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }